

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O2

back_insert_iterator<std::vector<char,_std::allocator<char>_>_>
utf8::append<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
          (uint32_t cp,back_insert_iterator<std::vector<char,_std::allocator<char>_>_> result)

{
  undefined8 *puVar1;
  byte bVar2;
  char *__args;
  char local_1a [10];
  
  if ((cp < 0x110000) && ((cp & 0xfffff800) != 0xd800)) {
    if (cp < 0x80) {
      __args = local_1a + 9;
    }
    else {
      bVar2 = (byte)cp;
      if (cp < 0x800) {
        local_1a[8] = (byte)(cp >> 6) | 0xc0;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(result.container,local_1a + 8);
        cp = (uint32_t)(bVar2 & 0x3f | 0x80);
        __args = local_1a + 7;
      }
      else if (cp < 0x10000) {
        local_1a[6] = (byte)(cp >> 0xc) | 0xe0;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(result.container,local_1a + 6);
        local_1a[5] = (byte)(cp >> 6) & 0x3f | 0x80;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(result.container,local_1a + 5);
        cp = (uint32_t)(bVar2 & 0x3f | 0x80);
        __args = local_1a + 4;
      }
      else {
        local_1a[3] = (byte)(cp >> 0x12) | 0xf0;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(result.container,local_1a + 3);
        local_1a[2] = (byte)(cp >> 0xc) & 0x3f | 0x80;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(result.container,local_1a + 2);
        local_1a[1] = (byte)(cp >> 6) & 0x3f | 0x80;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(result.container,local_1a + 1);
        cp = (uint32_t)(bVar2 & 0x3f | 0x80);
        __args = local_1a;
      }
    }
    *__args = (char)cp;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(result.container,__args);
    return (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
           (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)result.container;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_007a0710;
  *(uint32_t *)(puVar1 + 1) = cp;
  __cxa_throw(puVar1,&invalid_code_point::typeinfo,std::exception::~exception);
}

Assistant:

octet_iterator append(uint32_t cp, octet_iterator result)
    {
        if (!utf8::internal::is_code_point_valid(cp))
            throw invalid_code_point(cp);

        if (cp < 0x80)                        // one octet
            *(result++) = static_cast<uint8_t>(cp);
        else if (cp < 0x800) {                // two octets
            *(result++) = static_cast<uint8_t>((cp >> 6)            | 0xc0);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else if (cp < 0x10000) {              // three octets
            *(result++) = static_cast<uint8_t>((cp >> 12)           | 0xe0);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else {                                // four octets
            *(result++) = static_cast<uint8_t>((cp >> 18)           | 0xf0);
            *(result++) = static_cast<uint8_t>(((cp >> 12) & 0x3f)  | 0x80);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        return result;
    }